

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O0

ares_status_t ares_conn_set_sockaddr(ares_conn_t *conn,sockaddr *sa,ares_socklen_t *salen)

{
  int iVar1;
  ares_server_t *paVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  uint16_t local_4c;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  unsigned_short port;
  ares_server_t *server;
  ares_socklen_t *salen_local;
  sockaddr *sa_local;
  ares_conn_t *conn_local;
  
  paVar2 = conn->server;
  if ((conn->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
    local_4c = paVar2->udp_port;
  }
  else {
    local_4c = paVar2->tcp_port;
  }
  iVar1 = (paVar2->addr).family;
  if (iVar1 == 2) {
    if (*salen < 0x10) {
      conn_local._4_4_ = ARES_EFORMERR;
    }
    else {
      *salen = 0x10;
      memset(sa,0,0x10);
      sa->sa_family = 2;
      uVar4 = htons(local_4c);
      *(uint16_t *)sa->sa_data = uVar4;
      *(in_addr_t *)(sa->sa_data + 2) = (paVar2->addr).addr.addr4.s_addr;
      conn_local._4_4_ = ARES_SUCCESS;
    }
  }
  else if (iVar1 == 10) {
    if (*salen < 0x1c) {
      conn_local._4_4_ = ARES_EFORMERR;
    }
    else {
      *salen = 0x1c;
      memset(sa,0,0x1c);
      sa->sa_family = 10;
      uVar4 = htons(local_4c);
      *(uint16_t *)sa->sa_data = uVar4;
      *(undefined8 *)(sa->sa_data + 6) = *(undefined8 *)&(paVar2->addr).addr;
      uVar3 = *(undefined8 *)((long)&(paVar2->addr).addr + 8);
      sa[1].sa_family = (short)uVar3;
      sa[1].sa_data[0] = (char)((ulong)uVar3 >> 0x10);
      sa[1].sa_data[1] = (char)((ulong)uVar3 >> 0x18);
      sa[1].sa_data[2] = (char)((ulong)uVar3 >> 0x20);
      sa[1].sa_data[3] = (char)((ulong)uVar3 >> 0x28);
      sa[1].sa_data[4] = (char)((ulong)uVar3 >> 0x30);
      sa[1].sa_data[5] = (char)((ulong)uVar3 >> 0x38);
      *(uint *)(sa[1].sa_data + 6) = paVar2->ll_scope;
      conn_local._4_4_ = ARES_SUCCESS;
    }
  }
  else {
    conn_local._4_4_ = ARES_EBADFAMILY;
  }
  return conn_local._4_4_;
}

Assistant:

static ares_status_t ares_conn_set_sockaddr(const ares_conn_t *conn,
                                            struct sockaddr   *sa,
                                            ares_socklen_t    *salen)
{
  const ares_server_t *server = conn->server;
  unsigned short       port =
    conn->flags & ARES_CONN_FLAG_TCP ? server->tcp_port : server->udp_port;
  struct sockaddr_in  *sin;
  struct sockaddr_in6 *sin6;

  switch (server->addr.family) {
    case AF_INET:
      sin = (struct sockaddr_in *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin);
      memset(sin, 0, sizeof(*sin));
      sin->sin_family = AF_INET;
      sin->sin_port   = htons(port);
      memcpy(&sin->sin_addr, &server->addr.addr.addr4, sizeof(sin->sin_addr));
      return ARES_SUCCESS;
    case AF_INET6:
      sin6 = (struct sockaddr_in6 *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin6)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin6);
      memset(sin6, 0, sizeof(*sin6));
      sin6->sin6_family = AF_INET6;
      sin6->sin6_port   = htons(port);
      memcpy(&sin6->sin6_addr, &server->addr.addr.addr6,
             sizeof(sin6->sin6_addr));
#ifdef HAVE_STRUCT_SOCKADDR_IN6_SIN6_SCOPE_ID
      sin6->sin6_scope_id = server->ll_scope;
#endif
      return ARES_SUCCESS;
    default:
      break;
  }

  return ARES_EBADFAMILY;
}